

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawDoubleSky4PalCommand::Execute(DrawDoubleSky4PalCommand *this,DrawerThread *thread)

{
  int max;
  int iVar1;
  int iVar2;
  PalEntry PVar3;
  uchar *dest_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint b;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int c_blue_1;
  int c_green_1;
  int c_red_1;
  int inv_alpha_bottom;
  int alpha_bottom;
  uint32_t c_1;
  uint32_t sample_index2_2;
  int iStack_128;
  uint8_t fg_2;
  uint32_t sample_index_2;
  int col_5;
  uint32_t sample_index2_1;
  int iStack_118;
  uint8_t fg_1;
  uint32_t sample_index_1;
  int col_4;
  int c_blue;
  int c_green;
  int c_red;
  int inv_alpha_top;
  int alpha_top;
  uint32_t c;
  uint32_t sample_index2;
  int iStack_f0;
  uint8_t fg;
  uint32_t sample_index;
  int col_3;
  int col_2;
  int index;
  int num_cores;
  int col_1;
  int skipped;
  int col;
  int end_fadebottom_y;
  int start_fadebottom_y;
  int end_fadetop_y;
  int start_fadetop_y;
  int fade_length;
  uint32_t solid_bottom_fill;
  uint32_t solid_top_fill;
  int solid_bottom_b;
  int solid_bottom_g;
  int solid_bottom_r;
  int solid_top_b;
  int solid_top_g;
  int solid_top_r;
  int start_fade;
  uint8_t output [4];
  int32_t fracstep [4];
  int32_t frac [4];
  uint32_t *palette;
  uint32_t maxtextureheight1;
  int textureheight0;
  uint8_t *source1 [4];
  uint8_t *source0 [4];
  int pitch;
  int count;
  uint8_t *dest;
  DrawerThread *thread_local;
  DrawDoubleSky4PalCommand *this_local;
  
  dest_00 = (this->super_PalSkyCommand)._dest;
  max = (this->super_PalSkyCommand)._count;
  iVar10 = (this->super_PalSkyCommand)._pitch;
  source1[3] = (this->super_PalSkyCommand)._source[0];
  _maxtextureheight1 = (this->super_PalSkyCommand)._source2[0];
  source1[0] = (this->super_PalSkyCommand)._source2[1];
  source1[1] = (this->super_PalSkyCommand)._source2[2];
  source1[2] = (this->super_PalSkyCommand)._source2[3];
  iVar1 = (this->super_PalSkyCommand)._sourceheight[0];
  b = (this->super_PalSkyCommand)._sourceheight[1] - 1;
  fracstep[2] = (this->super_PalSkyCommand)._texturefrac[0];
  fracstep[3] = (this->super_PalSkyCommand)._texturefrac[1];
  start_fade = (this->super_PalSkyCommand)._iscale[0];
  output = (uint8_t  [4])(this->super_PalSkyCommand)._iscale[1];
  fracstep[0] = (this->super_PalSkyCommand)._iscale[2];
  fracstep[1] = (this->super_PalSkyCommand)._iscale[3];
  uVar13 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc >> 0x10 & 0xff;
  uVar14 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc >> 8 & 0xff;
  uVar15 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc & 0xff;
  uVar16 = (this->super_PalSkyCommand).solid_bottom >> 0x10 & 0xff;
  uVar17 = (this->super_PalSkyCommand).solid_bottom >> 8 & 0xff;
  uVar4 = (this->super_PalSkyCommand).solid_bottom & 0xff;
  uVar11 = (uint)RGB32k.All
                 [(long)((int)uVar15 >> 3) +
                  (long)((int)uVar14 >> 3) * 0x20 + (long)((int)uVar13 >> 3) * 0x400];
  uVar5 = (uint)RGB32k.All
                [(long)((int)uVar4 >> 3) +
                 (long)((int)uVar17 >> 3) * 0x20 + (long)((int)uVar16 >> 3) * 0x400];
  start_fadebottom_y = -fracstep[2] / start_fade;
  end_fadebottom_y = (0x400000 - fracstep[2]) / start_fade;
  col = (0x1c00000 - fracstep[2]) / start_fade;
  skipped = (0x2000000 - fracstep[2]) / start_fade;
  for (col_1 = 1; col_1 < 4; col_1 = col_1 + 1) {
    start_fadebottom_y = MIN<int>(start_fadebottom_y,-fracstep[2] / start_fade);
    end_fadebottom_y = MAX<int>(end_fadebottom_y,(0x400000 - fracstep[2]) / start_fade);
    col = MIN<int>(col,(0x1c00000 - fracstep[2]) / start_fade);
    skipped = MAX<int>(skipped,(0x2000000 - fracstep[2]) / start_fade);
  }
  iVar6 = clamp<int>(start_fadebottom_y,0,max);
  iVar7 = clamp<int>(end_fadebottom_y,0,max);
  iVar8 = clamp<int>(col,0,max);
  iVar9 = clamp<int>(skipped,0,max);
  col_3 = DrawerThread::skipped_by_thread
                    (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y);
  _pitch = (uint *)DrawerThread::dest_for_thread<unsigned_char>
                             (thread,(this->super_PalSkyCommand).super_DrawerCommand._dest_y,iVar10,
                              dest_00);
  for (index = 0; index < 4; index = index + 1) {
    fracstep[(long)index + 2] =
         *(int *)(output + (long)index * 4 + -4) * col_3 + fracstep[(long)index + 2];
    *(int *)(output + (long)index * 4 + -4) =
         thread->num_cores * *(int *)(output + (long)index * 4 + -4);
  }
  iVar10 = thread->num_cores * iVar10;
  iVar2 = thread->num_cores;
  for (; col_3 < iVar6; col_3 = iVar2 + col_3) {
    *_pitch = uVar11 << 0x18 | uVar11 << 0x10 | uVar11 << 8 | uVar11;
    _pitch = (uint *)((long)_pitch + (long)iVar10);
    for (sample_index = 0; (int)sample_index < 4; sample_index = sample_index + 1) {
      fracstep[(long)(int)sample_index + 2] =
           *(int *)(output + (long)(int)sample_index * 4 + -4) +
           fracstep[(long)(int)sample_index + 2];
    }
  }
  for (; col_3 < iVar7; col_3 = iVar2 + col_3) {
    for (iStack_f0 = 0; iStack_f0 < 4; iStack_f0 = iStack_f0 + 1) {
      uVar11 = ((uint)(fracstep[(long)iStack_f0 + 2] << 8) >> 0x10) * iVar1 >> 0x10;
      c._3_1_ = source1[(long)iStack_f0 + 3][uVar11];
      if (c._3_1_ == 0) {
        uVar11 = MIN<unsigned_int>(uVar11,b);
        c._3_1_ = *(byte *)(*(long *)(&maxtextureheight1 + (long)iStack_f0 * 2) + (ulong)uVar11);
      }
      *(byte *)((long)&solid_top_r + (long)iStack_f0) = c._3_1_;
      PVar3.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[c._3_1_].field_0.d
      ;
      iVar6 = MIN<int>(fracstep[(long)iStack_f0 + 2] >> 0xe,0x100);
      iVar6 = MAX<int>(iVar6,0);
      iVar12 = 0x100 - iVar6;
      *(BYTE *)((long)&solid_top_r + (long)iStack_f0) =
           RGB32k.All
           [(long)((int)(((uint)PVar3.field_0 & 0xff) * iVar6 + uVar15 * iVar12) >> 0xb) +
            (long)((int)(((uint)PVar3.field_0 >> 8 & 0xff) * iVar6 + uVar14 * iVar12) >> 0xb) * 0x20
            + (long)((int)(((uint)PVar3.field_0 >> 0x10 & 0xff) * iVar6 + uVar13 * iVar12) >> 0xb) *
              0x400];
      fracstep[(long)iStack_f0 + 2] =
           *(int *)(output + (long)iStack_f0 * 4 + -4) + fracstep[(long)iStack_f0 + 2];
    }
    *_pitch = solid_top_r;
    _pitch = (uint *)((long)_pitch + (long)iVar10);
  }
  for (; col_3 < iVar8; col_3 = iVar2 + col_3) {
    for (iStack_118 = 0; iStack_118 < 4; iStack_118 = iStack_118 + 1) {
      uVar11 = ((uint)(fracstep[(long)iStack_118 + 2] << 8) >> 0x10) * iVar1 >> 0x10;
      col_5._3_1_ = source1[(long)iStack_118 + 3][uVar11];
      if (col_5._3_1_ == '\0') {
        uVar11 = MIN<unsigned_int>(uVar11,b);
        col_5._3_1_ = *(uint8_t *)
                       (*(long *)(&maxtextureheight1 + (long)iStack_118 * 2) + (ulong)uVar11);
      }
      *(uint8_t *)((long)&solid_top_r + (long)iStack_118) = col_5._3_1_;
      fracstep[(long)iStack_118 + 2] =
           *(int *)(output + (long)iStack_118 * 4 + -4) + fracstep[(long)iStack_118 + 2];
    }
    *_pitch = solid_top_r;
    _pitch = (uint *)((long)_pitch + (long)iVar10);
  }
  for (; col_3 < iVar9; col_3 = iVar2 + col_3) {
    for (iStack_128 = 0; iStack_128 < 4; iStack_128 = iStack_128 + 1) {
      uVar11 = ((uint)(fracstep[(long)iStack_128 + 2] << 8) >> 0x10) * iVar1 >> 0x10;
      c_1._3_1_ = source1[(long)iStack_128 + 3][uVar11];
      if (c_1._3_1_ == 0) {
        uVar11 = MIN<unsigned_int>(uVar11,b);
        c_1._3_1_ = *(byte *)(*(long *)(&maxtextureheight1 + (long)iStack_128 * 2) + (ulong)uVar11);
      }
      *(byte *)((long)&solid_top_r + (long)iStack_128) = c_1._3_1_;
      PVar3.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[c_1._3_1_].field_0.d;
      iVar6 = MIN<int>(0x2000000 - fracstep[(long)iStack_128 + 2] >> 0xe,0x100);
      iVar6 = MAX<int>(iVar6,0);
      iVar7 = 0x100 - iVar6;
      *(BYTE *)((long)&solid_top_r + (long)iStack_128) =
           RGB32k.All
           [(long)((int)(((uint)PVar3.field_0 & 0xff) * iVar6 + uVar4 * iVar7) >> 0xb) +
            (long)((int)(((uint)PVar3.field_0 >> 8 & 0xff) * iVar6 + uVar17 * iVar7) >> 0xb) * 0x20
            + (long)((int)(((uint)PVar3.field_0 >> 0x10 & 0xff) * iVar6 + uVar16 * iVar7) >> 0xb) *
              0x400];
      fracstep[(long)iStack_128 + 2] =
           *(int *)(output + (long)iStack_128 * 4 + -4) + fracstep[(long)iStack_128 + 2];
    }
    *_pitch = solid_top_r;
    _pitch = (uint *)((long)_pitch + (long)iVar10);
  }
  for (; col_3 < max; col_3 = iVar2 + col_3) {
    *_pitch = uVar5 << 0x18 | uVar5 << 0x10 | uVar5 << 8 | uVar5;
    _pitch = (uint *)((long)_pitch + (long)iVar10);
  }
  return;
}

Assistant:

void DrawDoubleSky4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0[4] = { _source[0], _source[1], _source[2], _source[3] };
		const uint8_t *source1[4] = { _source2[0], _source2[1], _source2[2], _source2[3] };
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;
		const uint32_t *palette = (const uint32_t *)GPalette.BaseColors;
		int32_t frac[4] = { (int32_t)_texturefrac[0], (int32_t)_texturefrac[1], (int32_t)_texturefrac[2], (int32_t)_texturefrac[3] };
		int32_t fracstep[4] = { (int32_t)_iscale[0], (int32_t)_iscale[1], (int32_t)_iscale[2], (int32_t)_iscale[3] };
		uint8_t output[4];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);
		uint32_t solid_top_fill = RGB32k.RGB[(solid_top_r >> 3)][(solid_top_g >> 3)][(solid_top_b >> 3)];
		uint32_t solid_bottom_fill = RGB32k.RGB[(solid_bottom_r >> 3)][(solid_bottom_g >> 3)][(solid_bottom_b >> 3)];
		solid_top_fill = (solid_top_fill << 24) | (solid_top_fill << 16) | (solid_top_fill << 8) | solid_top_fill;
		solid_bottom_fill = (solid_bottom_fill << 24) | (solid_bottom_fill << 16) | (solid_bottom_fill << 8) | solid_bottom_fill;

		// Find bands for top solid color, top fade, center textured, bottom fade, bottom solid color:
		int fade_length = (1 << (24 - start_fade));
		int start_fadetop_y = (-frac[0]) / fracstep[0];
		int end_fadetop_y = (fade_length - frac[0]) / fracstep[0];
		int start_fadebottom_y = ((2 << 24) - fade_length - frac[0]) / fracstep[0];
		int end_fadebottom_y = ((2 << 24) - frac[0]) / fracstep[0];
		for (int col = 1; col < 4; col++)
		{
			start_fadetop_y = MIN(start_fadetop_y, (-frac[0]) / fracstep[0]);
			end_fadetop_y = MAX(end_fadetop_y, (fade_length - frac[0]) / fracstep[0]);
			start_fadebottom_y = MIN(start_fadebottom_y, ((2 << 24) - fade_length - frac[0]) / fracstep[0]);
			end_fadebottom_y = MAX(end_fadebottom_y, ((2 << 24) - frac[0]) / fracstep[0]);
		}
		start_fadetop_y = clamp(start_fadetop_y, 0, count);
		end_fadetop_y = clamp(end_fadetop_y, 0, count);
		start_fadebottom_y = clamp(start_fadebottom_y, 0, count);
		end_fadebottom_y = clamp(end_fadebottom_y, 0, count);

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int col = 0; col < 4; col++)
		{
			frac[col] += fracstep[col] * skipped;
			fracstep[col] *= thread->num_cores;
		}
		pitch *= thread->num_cores;
		int num_cores = thread->num_cores;
		int index = skipped;

		// Top solid color:
		while (index < start_fadetop_y)
		{
			*((uint32_t*)dest) = solid_top_fill;
			dest += pitch;
			for (int col = 0; col < 4; col++)
				frac[col] += fracstep[col];
			index += num_cores;
		}

		// Top fade:
		while (index < end_fadetop_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_top = MAX(MIN(frac[col] >> (16 - start_fade), 256), 0);
				int inv_alpha_top = 256 - alpha_top;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Textured center:
		while (index < start_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				frac[col] += fracstep[col];
			}

			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Fade bottom:
		while (index < end_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_bottom = MAX(MIN(((2 << 24) - frac[col]) >> (16 - start_fade), 256), 0);
				int inv_alpha_bottom = 256 - alpha_bottom;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Bottom solid color:
		while (index < count)
		{
			*((uint32_t*)dest) = solid_bottom_fill;
			dest += pitch;
			index += num_cores;
		}
	}